

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,ForStatement *statement)

{
  Expression *pEVar1;
  CompoundStatement *pCVar2;
  ForStatement *statement_local;
  PrettyPrinter *this_local;
  
  std::operator<<((ostream *)&this->field_0x20,"for ");
  pEVar1 = ForStatement::getE1(statement);
  if (pEVar1 != (Expression *)0x0) {
    pEVar1 = ForStatement::getE1(statement);
    (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  }
  std::operator<<((ostream *)&this->field_0x20,";");
  pEVar1 = ForStatement::getE2(statement);
  if (pEVar1 != (Expression *)0x0) {
    std::operator<<((ostream *)&this->field_0x20," ");
    pEVar1 = ForStatement::getE2(statement);
    (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  }
  std::operator<<((ostream *)&this->field_0x20,";");
  pEVar1 = ForStatement::getE3(statement);
  if (pEVar1 != (Expression *)0x0) {
    std::operator<<((ostream *)&this->field_0x20," ");
    pEVar1 = ForStatement::getE3(statement);
    (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  }
  std::operator<<((ostream *)&this->field_0x20,":\n");
  indent(this);
  pCVar2 = ForStatement::getStatements(statement);
  (**(pCVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pCVar2,this);
  dedent(this);
  return;
}

Assistant:

void PrettyPrinter::visit(ForStatement* statement) {
    output << "for ";

    if (statement->getE1()) {
        statement->getE1()->accept(this);
    }

    output << ";";

    if (statement->getE2()) {
        output << " ";
        statement->getE2()->accept(this);
    }

    output << ";";

    if (statement->getE3()) {
        output << " ";
        statement->getE3()->accept(this);
    }

    output << ":\n";

    indent();
    statement->getStatements()->accept(this);
    dedent();
}